

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O0

void ncnn::convolution_im2col_input_tile_int8
               (Mat *bottom_blob,Mat *B,int j,int max_jj,int k,int max_kk,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h)

{
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000950;
  int in_stack_00000954;
  int in_stack_00000958;
  int in_stack_0000095c;
  Mat *in_stack_00000960;
  Mat *in_stack_00000968;
  int in_stack_00001ae0;
  int in_stack_00001ae4;
  int in_stack_00001ae8;
  int in_stack_00001aec;
  Mat *in_stack_00001af0;
  Mat *in_stack_00001af8;
  
  if ((((in_stack_00000008 == 1) && (in_stack_00000010 == 1)) && (in_stack_00000018 == 1)) &&
     (((in_stack_00000020 == 1 && (in_stack_00000028 == 1)) && (max_kk == 1)))) {
    convolution_im2col_input_tile_conv1x1s1d1_int8
              (in_stack_00000968,in_stack_00000960,in_stack_0000095c,in_stack_00000958,
               in_stack_00000954,in_stack_00000950);
  }
  else {
    convolution_im2col_input_tile_int8_impl
              (in_stack_00001af8,in_stack_00001af0,in_stack_00001aec,in_stack_00001ae8,
               in_stack_00001ae4,in_stack_00001ae0,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,max_kk,in_R9D);
  }
  return;
}

Assistant:

static void convolution_im2col_input_tile_int8(const Mat& bottom_blob, Mat& B, int j, int max_jj, int k, int max_kk, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        convolution_im2col_input_tile_int8_avx512vnni(bottom_blob, B, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNIINT8 && __AVX__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni_int8())
    {
        convolution_im2col_input_tile_int8_avxvnniint8(bottom_blob, B, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        convolution_im2col_input_tile_int8_avxvnni(bottom_blob, B, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        convolution_im2col_input_tile_int8_avx2(bottom_blob, B, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
        return;
    }
#endif

    if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        convolution_im2col_input_tile_conv1x1s1d1_int8(bottom_blob, B, j, max_jj, k, max_kk);
        return;
    }

    // TODO specialized template initialization for 1x1s2 3x3s1 3x2s2 5x5s1 5x5s2 7x7s2

    convolution_im2col_input_tile_int8_impl(bottom_blob, B, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
}